

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::handleTabletEvent(QWidgetWindow *this,QTabletEvent *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  Data *pDVar4;
  undefined4 uVar5;
  uint uVar6;
  QWidget *pQVar7;
  Data *pDVar8;
  ulong uVar9;
  QPoint QVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long in_FS_OFFSET;
  byte bVar15;
  undefined4 uVar16;
  double extraout_XMM0_Qa;
  QTabletEvent *pQVar17;
  undefined1 auVar18 [16];
  undefined1 extraout_XMM1_Be;
  double extraout_XMM1_Qa;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 local_b8 [16];
  QTabletEvent ev;
  undefined1 uStack_9c;
  qreal local_a0;
  double local_48;
  double dStack_40;
  long local_38;
  
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (handleTabletEvent(QTabletEvent*)::qt_tablet_target == '\0') {
    handleTabletEvent();
  }
  if ((handleTabletEvent::qt_tablet_target.wp.d == (Data *)0x0) ||
     (*(int *)(handleTabletEvent::qt_tablet_target.wp.d + 4) == 0)) {
    pQVar7 = (QWidget *)0x0;
  }
  else {
    pQVar7 = (QWidget *)handleTabletEvent::qt_tablet_target.wp.value;
  }
  if (pQVar7 == (QWidget *)0x0) {
    pDVar8 = (this->m_widget).wp.d;
    if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
      pQVar7 = (QWidget *)0x0;
    }
    else {
      pQVar7 = (QWidget *)(this->m_widget).wp.value;
    }
    _ev = (QPoint)QEventPoint::position();
    pQVar7 = QWidget::childAt(pQVar7,(QPointF *)&ev);
    if (pQVar7 == (QWidget *)0x0) {
      pDVar8 = (this->m_widget).wp.d;
      if ((pDVar8 == (Data *)0x0) || (*(int *)(pDVar8 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      else {
        pQVar7 = (QWidget *)(this->m_widget).wp.value;
      }
    }
    uStack_9c = extraout_XMM1_Be;
    if (*(short *)(event + 8) == 0x5c) {
      if (pQVar7 == (QWidget *)0x0) {
        pDVar8 = (Data *)0x0;
      }
      else {
        pDVar8 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar7->super_QObject);
      }
      pDVar4 = handleTabletEvent::qt_tablet_target.wp.d;
      handleTabletEvent::qt_tablet_target.wp.value = &pQVar7->super_QObject;
      handleTabletEvent::qt_tablet_target.wp.d = pDVar8;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar4 = *(int *)pDVar4 + -1;
        UNLOCK();
        if (*(int *)pDVar4 == 0) {
          operator_delete(pDVar4);
        }
      }
    }
  }
  if (pQVar7 != (QWidget *)0x0) {
    auVar21 = QEventPoint::globalPosition();
    auVar22 = QEventPoint::globalPosition();
    local_48 = -NAN;
    dStack_40 = -NAN;
    uVar5 = QEventPoint::globalPosition();
    auVar19._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar19._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar19 = minpd(_DAT_0066f5d0,auVar19);
    auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
    auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
    uVar6 = movmskpd(uVar5,auVar18);
    uVar13 = 0x8000000000000000;
    if ((uVar6 & 1) != 0) {
      uVar13 = (ulong)(uint)(int)auVar19._0_8_ << 0x20;
    }
    uVar9 = 0x80000000;
    if ((uVar6 & 2) != 0) {
      uVar9 = (ulong)(uint)(int)auVar19._8_8_;
    }
    _ev = (QPoint)(uVar9 | uVar13);
    QVar10 = QWidget::mapFromGlobal(pQVar7,(QPoint *)&ev);
    auVar20._0_8_ =
         (double)((ulong)auVar22._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar22._0_8_;
    auVar20._8_8_ =
         (double)((ulong)auVar22._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar22._8_8_;
    auVar19 = minpd(_DAT_0066f5d0,auVar20);
    auVar19 = maxpd(auVar19,_DAT_0066f5e0);
    local_48 = (double)QVar10.xp.m_i.m_i + (auVar21._0_8_ - (double)(int)auVar19._0_8_);
    dStack_40 = (double)QVar10.yp.m_i.m_i + (auVar21._8_8_ - (double)(int)auVar19._8_8_);
    puVar14 = &DAT_006756c0;
    pQVar17 = &ev;
    for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined8 *)pQVar17 = *puVar14;
      puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
      pQVar17 = pQVar17 + (ulong)bVar15 * -0x10 + 8;
    }
    uVar3 = *(undefined2 *)(event + 8);
    uVar11 = QPointerEvent::pointingDevice();
    local_b8 = QEventPoint::globalPosition();
    pQVar17 = (QTabletEvent *)QEventPoint::pressure();
    uVar5 = *(undefined4 *)(event + 0x54);
    uVar1 = *(undefined4 *)(event + 0x58);
    uVar2 = *(undefined4 *)(event + 0x50);
    uVar16 = QEventPoint::rotation();
    QTabletEvent::QTabletEvent
              (pQVar17,uVar5,uVar1,uVar2,uVar16,*(undefined4 *)(event + 0x5c),&ev,uVar3,uVar11,
               &local_48,local_b8,*(undefined4 *)(event + 0x20),*(undefined4 *)(event + 0x40),
               *(undefined4 *)(event + 0x44));
    QPointerEvent::setTimestamp((ulonglong)&ev);
    QPointerEvent::setAccepted(SUB81(&ev,0));
    QCoreApplication::forwardEvent(&pQVar7->super_QObject,(QEvent *)&ev,(QEvent *)event);
    (**(code **)(*(long *)event + 0x10))(event,uStack_9c);
    QTabletEvent::~QTabletEvent(&ev);
  }
  if ((*(short *)(event + 8) == 0x5d) && (*(int *)(event + 0x44) == 0)) {
    pDVar8 = handleTabletEvent::qt_tablet_target.wp.d;
    handleTabletEvent::qt_tablet_target.wp.d = (Data *)0x0;
    handleTabletEvent::qt_tablet_target.wp.value = (QObject *)0x0;
    if (pDVar8 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar8 = *(int *)pDVar8 + -1;
      UNLOCK();
      if (*(int *)pDVar8 == 0) {
        operator_delete(pDVar8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleTabletEvent(QTabletEvent *event)
{
    static QPointer<QWidget> qt_tablet_target = nullptr;

    QWidget *widget = qt_tablet_target;

    if (!widget) {
        widget = m_widget->childAt(event->position());
        if (!widget)
            widget = m_widget;
        if (event->type() == QEvent::TabletPress)
            qt_tablet_target = widget;
    }

    if (widget) {
        QPointF delta = event->globalPosition() - event->globalPosition().toPoint();
        QPointF mapped = widget->mapFromGlobal(event->globalPosition().toPoint()) + delta;
        QTabletEvent ev(event->type(), event->pointingDevice(), mapped, event->globalPosition(),
                        event->pressure(), event->xTilt(), event->yTilt(), event->tangentialPressure(),
                        event->rotation(), event->z(), event->modifiers(), event->button(), event->buttons());
        ev.setTimestamp(event->timestamp());
        ev.setAccepted(false);
        QGuiApplication::forwardEvent(widget, &ev, event);
        event->setAccepted(ev.isAccepted());
    }

    if (event->type() == QEvent::TabletRelease && event->buttons() == Qt::NoButton)
        qt_tablet_target = nullptr;
}